

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::V1LayerParameter::InternalSerializeWithCachedSizesToArray
          (V1LayerParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  int iVar2;
  V0LayerParameter *this_00;
  char *pcVar3;
  string *psVar4;
  Rep *pRVar5;
  ConcatParameter *this_01;
  ConvolutionParameter *this_02;
  DataParameter *this_03;
  DropoutParameter *this_04;
  HDF5DataParameter *this_05;
  HDF5OutputParameter *this_06;
  ImageDataParameter *this_07;
  InfogainLossParameter *this_08;
  InnerProductParameter *this_09;
  LRNParameter *this_10;
  PoolingParameter *this_11;
  WindowDataParameter *this_12;
  PowerParameter *this_13;
  MemoryDataParameter *this_14;
  ArgMaxParameter *this_15;
  EltwiseParameter *this_16;
  ThresholdParameter *this_17;
  DummyDataParameter *this_18;
  AccuracyParameter *this_19;
  HingeLossParameter *this_20;
  ReLUParameter *this_21;
  SliceParameter *this_22;
  MVNParameter *this_23;
  TransformationParameter *this_24;
  TanHParameter *this_25;
  SigmoidParameter *this_26;
  SoftmaxParameter *this_27;
  ContrastiveLossParameter *this_28;
  ExpParameter *this_29;
  LossParameter *this_30;
  Rep *pRVar6;
  void *pvVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  Type *pTVar11;
  Type *this_31;
  LogMessage *pLVar12;
  Type *pTVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  byte *pbVar20;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar21;
  LogFinisher local_115;
  uint local_114;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_114 = (this->_has_bits_).has_bits_[0];
  if ((local_114 & 2) != 0) {
    this_00 = this->layer_;
    *target = '\n';
    pbVar20 = target + 1;
    uVar14 = this_00->_cached_size_;
    uVar9 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar9 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar9;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar9;
    target = V0LayerParameter::InternalSerializeWithCachedSizesToArray(this_00,false,pbVar20 + 1);
  }
  iVar2 = (this->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    pRVar21 = &this->bottom_;
    iVar17 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar17);
      pcVar3 = (pTVar11->_M_dataplus)._M_p;
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar17);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar3,(int)pTVar11->_M_string_length,SERIALIZE,"caffe.V1LayerParameter.bottom");
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar17);
      *target = 0x12;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar11,target + 1);
      iVar17 = iVar17 + 1;
    } while (iVar2 != iVar17);
  }
  iVar2 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    pRVar21 = &this->top_;
    iVar17 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar17);
      pcVar3 = (pTVar11->_M_dataplus)._M_p;
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar17);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar3,(int)pTVar11->_M_string_length,SERIALIZE,"caffe.V1LayerParameter.top");
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar17);
      *target = 0x1a;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar11,target + 1);
      iVar17 = iVar17 + 1;
    } while (iVar2 != iVar17);
  }
  if ((local_114 & 1) != 0) {
    psVar4 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.V1LayerParameter.name");
    psVar4 = (this->name_).ptr_;
    *target = 0x22;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar4,target + 1);
  }
  if (((this->_has_bits_).has_bits_[1] & 1) != 0) {
    uVar15 = (ulong)this->type_;
    pbVar20 = target + 1;
    *target = 0x28;
    uVar16 = uVar15;
    if (0x7f < uVar15) {
      do {
        *pbVar20 = (byte)uVar15 | 0x80;
        uVar16 = uVar15 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar15;
        uVar15 = uVar16;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar16;
    target = pbVar20 + 1;
  }
  iVar2 = (this->blobs_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar17 = 0;
    do {
      this_31 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(this->blobs_).super_RepeatedPtrFieldBase,iVar17);
      *target = 0x32;
      pbVar20 = target + 1;
      uVar14 = this_31->_cached_size_;
      uVar9 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar20 = (byte)uVar14 | 0x80;
          uVar9 = uVar14 >> 7;
          pbVar20 = pbVar20 + 1;
          bVar8 = 0x3fff < uVar14;
          uVar14 = uVar9;
        } while (bVar8);
      }
      *pbVar20 = (byte)uVar9;
      target = BlobProto::InternalSerializeWithCachedSizesToArray(this_31,false,pbVar20 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar2);
  }
  uVar14 = (this->blobs_lr_).current_size_;
  if (uVar14 != 0) {
    if ((this->blobs_lr_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar12 = google::protobuf::internal::LogMessage::operator<<(&local_d8,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar12);
      google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
    }
    pRVar5 = (this->blobs_lr_).rep_;
    uVar15 = 1;
    if (1 < (int)uVar14) {
      uVar15 = (ulong)uVar14;
    }
    uVar16 = 0;
    do {
      fVar1 = pRVar5->elements[uVar16];
      *target = 0x3d;
      *(float *)(target + 1) = fVar1;
      target = target + 5;
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  uVar14 = (this->weight_decay_).current_size_;
  if (uVar14 != 0) {
    if ((this->weight_decay_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar12 = google::protobuf::internal::LogMessage::operator<<(&local_a0,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar12);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    pRVar5 = (this->weight_decay_).rep_;
    uVar15 = 1;
    if (1 < (int)uVar14) {
      uVar15 = (ulong)uVar14;
    }
    uVar16 = 0;
    do {
      fVar1 = pRVar5->elements[uVar16];
      *target = 0x45;
      *(float *)(target + 1) = fVar1;
      target = target + 5;
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  uVar14 = (this->_has_bits_).has_bits_[0];
  if ((uVar14 & 4) != 0) {
    this_01 = this->concat_param_;
    *target = 0x4a;
    pbVar20 = target + 1;
    uVar9 = this_01->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ConcatParameter::InternalSerializeWithCachedSizesToArray(this_01,false,pbVar20 + 1);
  }
  if ((uVar14 & 8) != 0) {
    this_02 = this->convolution_param_;
    *target = 0x52;
    pbVar20 = target + 1;
    uVar9 = this_02->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ConvolutionParameter::InternalSerializeWithCachedSizesToArray
                       (this_02,false,pbVar20 + 1);
  }
  if ((uVar14 & 0x10) != 0) {
    this_03 = this->data_param_;
    *target = 0x5a;
    pbVar20 = target + 1;
    uVar9 = this_03->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = DataParameter::InternalSerializeWithCachedSizesToArray(this_03,false,pbVar20 + 1);
  }
  if ((uVar14 & 0x20) != 0) {
    this_04 = this->dropout_param_;
    *target = 0x62;
    pbVar20 = target + 1;
    uVar9 = this_04->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = DropoutParameter::InternalSerializeWithCachedSizesToArray(this_04,false,pbVar20 + 1);
  }
  if ((uVar14 & 0x40) != 0) {
    this_05 = this->hdf5_data_param_;
    *target = 0x6a;
    pbVar20 = target + 1;
    uVar9 = this_05->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = HDF5DataParameter::InternalSerializeWithCachedSizesToArray(this_05,false,pbVar20 + 1);
  }
  if ((char)uVar14 < '\0') {
    this_06 = this->hdf5_output_param_;
    *target = 0x72;
    pbVar20 = target + 1;
    uVar9 = this_06->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = HDF5OutputParameter::InternalSerializeWithCachedSizesToArray(this_06,false,pbVar20 + 1)
    ;
  }
  if ((uVar14 >> 8 & 1) != 0) {
    this_07 = this->image_data_param_;
    *target = 0x7a;
    pbVar20 = target + 1;
    uVar9 = this_07->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ImageDataParameter::InternalSerializeWithCachedSizesToArray(this_07,false,pbVar20 + 1);
  }
  if ((uVar14 >> 9 & 1) != 0) {
    this_08 = this->infogain_loss_param_;
    target[0] = 0x82;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_08->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = InfogainLossParameter::InternalSerializeWithCachedSizesToArray
                       (this_08,false,pbVar20 + 1);
  }
  if ((uVar14 >> 10 & 1) != 0) {
    this_09 = this->inner_product_param_;
    target[0] = 0x8a;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_09->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = InnerProductParameter::InternalSerializeWithCachedSizesToArray
                       (this_09,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0xb & 1) != 0) {
    this_10 = this->lrn_param_;
    target[0] = 0x92;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_10->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = LRNParameter::InternalSerializeWithCachedSizesToArray(this_10,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0xc & 1) != 0) {
    this_11 = this->pooling_param_;
    target[0] = 0x9a;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_11->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = PoolingParameter::InternalSerializeWithCachedSizesToArray(this_11,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0xd & 1) != 0) {
    this_12 = this->window_data_param_;
    target[0] = 0xa2;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_12->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = WindowDataParameter::InternalSerializeWithCachedSizesToArray(this_12,false,pbVar20 + 1)
    ;
  }
  if ((uVar14 >> 0xe & 1) != 0) {
    this_13 = this->power_param_;
    target[0] = 0xaa;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_13->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = PowerParameter::InternalSerializeWithCachedSizesToArray(this_13,false,pbVar20 + 1);
  }
  if ((short)uVar14 < 0) {
    this_14 = this->memory_data_param_;
    target[0] = 0xb2;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_14->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = MemoryDataParameter::InternalSerializeWithCachedSizesToArray(this_14,false,pbVar20 + 1)
    ;
  }
  if ((uVar14 >> 0x10 & 1) != 0) {
    this_15 = this->argmax_param_;
    target[0] = 0xba;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_15->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ArgMaxParameter::InternalSerializeWithCachedSizesToArray(this_15,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x11 & 1) != 0) {
    this_16 = this->eltwise_param_;
    target[0] = 0xc2;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_16->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = EltwiseParameter::InternalSerializeWithCachedSizesToArray(this_16,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x12 & 1) != 0) {
    this_17 = this->threshold_param_;
    target[0] = 0xca;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_17->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ThresholdParameter::InternalSerializeWithCachedSizesToArray(this_17,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x13 & 1) != 0) {
    this_18 = this->dummy_data_param_;
    target[0] = 0xd2;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_18->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = DummyDataParameter::InternalSerializeWithCachedSizesToArray(this_18,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x14 & 1) != 0) {
    this_19 = this->accuracy_param_;
    target[0] = 0xda;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_19->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = AccuracyParameter::InternalSerializeWithCachedSizesToArray(this_19,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x15 & 1) != 0) {
    this_20 = this->hinge_loss_param_;
    target[0] = 0xea;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_20->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = HingeLossParameter::InternalSerializeWithCachedSizesToArray(this_20,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x16 & 1) != 0) {
    this_21 = this->relu_param_;
    target[0] = 0xf2;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_21->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ReLUParameter::InternalSerializeWithCachedSizesToArray(this_21,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x17 & 1) != 0) {
    this_22 = this->slice_param_;
    target[0] = 0xfa;
    target[1] = 1;
    pbVar20 = target + 2;
    uVar9 = this_22->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = SliceParameter::InternalSerializeWithCachedSizesToArray(this_22,false,pbVar20 + 1);
  }
  iVar2 = (this->include_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar17 = 0;
    do {
      pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                          (&(this->include_).super_RepeatedPtrFieldBase,iVar17);
      target[0] = 0x82;
      target[1] = 2;
      pbVar20 = target + 2;
      uVar9 = pTVar13->_cached_size_;
      uVar10 = uVar9;
      if (0x7f < uVar9) {
        do {
          *pbVar20 = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          pbVar20 = pbVar20 + 1;
          bVar8 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar8);
      }
      *pbVar20 = (byte)uVar10;
      target = NetStateRule::InternalSerializeWithCachedSizesToArray(pTVar13,false,pbVar20 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar2);
  }
  iVar2 = (this->exclude_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar17 = 0;
    do {
      pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                          (&(this->exclude_).super_RepeatedPtrFieldBase,iVar17);
      target[0] = 0x8a;
      target[1] = 2;
      pbVar20 = target + 2;
      uVar9 = pTVar13->_cached_size_;
      uVar10 = uVar9;
      if (0x7f < uVar9) {
        do {
          *pbVar20 = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          pbVar20 = pbVar20 + 1;
          bVar8 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar8);
      }
      *pbVar20 = (byte)uVar10;
      target = NetStateRule::InternalSerializeWithCachedSizesToArray(pTVar13,false,pbVar20 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar2);
  }
  if ((uVar14 >> 0x18 & 1) != 0) {
    this_23 = this->mvn_param_;
    target[0] = 0x92;
    target[1] = 2;
    pbVar20 = target + 2;
    uVar9 = this_23->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = MVNParameter::InternalSerializeWithCachedSizesToArray(this_23,false,pbVar20 + 1);
  }
  uVar9 = (this->loss_weight_).current_size_;
  if (uVar9 != 0) {
    if ((this->loss_weight_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar12 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar12);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pRVar5 = (this->loss_weight_).rep_;
    uVar15 = 1;
    if (1 < (int)uVar9) {
      uVar15 = (ulong)uVar9;
    }
    uVar16 = 0;
    do {
      fVar1 = pRVar5->elements[uVar16];
      target[0] = 0x9d;
      target[1] = 2;
      *(float *)(target + 2) = fVar1;
      target = target + 6;
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  if ((uVar14 >> 0x19 & 1) != 0) {
    this_24 = this->transform_param_;
    target[0] = 0xa2;
    target[1] = 2;
    pbVar20 = target + 2;
    uVar9 = this_24->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = TransformationParameter::InternalSerializeWithCachedSizesToArray
                       (this_24,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x1a & 1) != 0) {
    this_25 = this->tanh_param_;
    target[0] = 0xaa;
    target[1] = 2;
    pbVar20 = target + 2;
    uVar9 = this_25->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = TanHParameter::InternalSerializeWithCachedSizesToArray(this_25,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x1b & 1) != 0) {
    this_26 = this->sigmoid_param_;
    target[0] = 0xb2;
    target[1] = 2;
    pbVar20 = target + 2;
    uVar9 = this_26->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = SigmoidParameter::InternalSerializeWithCachedSizesToArray(this_26,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x1c & 1) != 0) {
    this_27 = this->softmax_param_;
    target[0] = 0xba;
    target[1] = 2;
    pbVar20 = target + 2;
    uVar9 = this_27->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = SoftmaxParameter::InternalSerializeWithCachedSizesToArray(this_27,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x1d & 1) != 0) {
    this_28 = this->contrastive_loss_param_;
    target[0] = 0xc2;
    target[1] = 2;
    pbVar20 = target + 2;
    uVar9 = this_28->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ContrastiveLossParameter::InternalSerializeWithCachedSizesToArray
                       (this_28,false,pbVar20 + 1);
  }
  if ((uVar14 >> 0x1e & 1) != 0) {
    this_29 = this->exp_param_;
    target[0] = 0xca;
    target[1] = 2;
    pbVar20 = target + 2;
    uVar9 = this_29->_cached_size_;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar20 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ExpParameter::InternalSerializeWithCachedSizesToArray(this_29,false,pbVar20 + 1);
  }
  if ((int)uVar14 < 0) {
    this_30 = this->loss_param_;
    target[0] = 0xd2;
    target[1] = 2;
    pbVar20 = target + 2;
    uVar14 = this_30->_cached_size_;
    uVar9 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar9 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar9;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar9;
    target = LossParameter::InternalSerializeWithCachedSizesToArray(this_30,false,pbVar20 + 1);
  }
  iVar2 = (this->param_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    pRVar21 = &this->param_;
    iVar17 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar17);
      pcVar3 = (pTVar11->_M_dataplus)._M_p;
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar17);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar3,(int)pTVar11->_M_string_length,SERIALIZE,"caffe.V1LayerParameter.param");
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar17);
      target[0] = 0xca;
      target[1] = 0x3e;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar11,target + 2);
      iVar17 = iVar17 + 1;
    } while (iVar2 != iVar17);
  }
  uVar14 = (this->blob_share_mode_).current_size_;
  if (uVar14 != 0) {
    if ((this->blob_share_mode_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar12 = google::protobuf::internal::LogMessage::operator<<
                          (&local_110,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_115,pLVar12);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    pRVar6 = (this->blob_share_mode_).rep_;
    uVar15 = 1;
    if (1 < (int)uVar14) {
      uVar15 = (ulong)uVar14;
    }
    uVar16 = 0;
    do {
      uVar18 = (ulong)pRVar6->elements[uVar16];
      pbVar20 = target + 2;
      target[0] = 0xd0;
      target[1] = 0x3e;
      uVar19 = uVar18;
      if (0x7f < uVar18) {
        do {
          *pbVar20 = (byte)uVar18 | 0x80;
          uVar19 = uVar18 >> 7;
          pbVar20 = pbVar20 + 1;
          bVar8 = 0x3fff < uVar18;
          uVar18 = uVar19;
        } while (bVar8);
      }
      *pbVar20 = (byte)uVar19;
      target = pbVar20 + 1;
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar15);
  }
  pvVar7 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar7 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar7 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* V1LayerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.V1LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.V0LayerParameter layer = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, *this->layer_, deterministic, target);
  }

  // repeated string bottom = 2;
  for (int i = 0, n = this->bottom_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->bottom(i).data(), this->bottom(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.bottom");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(2, this->bottom(i), target);
  }

  // repeated string top = 3;
  for (int i = 0, n = this->top_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->top(i).data(), this->top(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.top");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->top(i), target);
  }

  // optional string name = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->name(), target);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.V1LayerParameter.LayerType type = 5;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      5, this->type(), target);
  }

  // repeated .caffe.BlobProto blobs = 6;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->blobs(i), deterministic, target);
  }

  // repeated float blobs_lr = 7;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(7, this->blobs_lr_, target);

  // repeated float weight_decay = 8;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(8, this->weight_decay_, target);

  cached_has_bits = _has_bits_[0];
  // optional .caffe.ConcatParameter concat_param = 9;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, *this->concat_param_, deterministic, target);
  }

  // optional .caffe.ConvolutionParameter convolution_param = 10;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        10, *this->convolution_param_, deterministic, target);
  }

  // optional .caffe.DataParameter data_param = 11;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        11, *this->data_param_, deterministic, target);
  }

  // optional .caffe.DropoutParameter dropout_param = 12;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        12, *this->dropout_param_, deterministic, target);
  }

  // optional .caffe.HDF5DataParameter hdf5_data_param = 13;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        13, *this->hdf5_data_param_, deterministic, target);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 14;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        14, *this->hdf5_output_param_, deterministic, target);
  }

  // optional .caffe.ImageDataParameter image_data_param = 15;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        15, *this->image_data_param_, deterministic, target);
  }

  // optional .caffe.InfogainLossParameter infogain_loss_param = 16;
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        16, *this->infogain_loss_param_, deterministic, target);
  }

  // optional .caffe.InnerProductParameter inner_product_param = 17;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        17, *this->inner_product_param_, deterministic, target);
  }

  // optional .caffe.LRNParameter lrn_param = 18;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        18, *this->lrn_param_, deterministic, target);
  }

  // optional .caffe.PoolingParameter pooling_param = 19;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        19, *this->pooling_param_, deterministic, target);
  }

  // optional .caffe.WindowDataParameter window_data_param = 20;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        20, *this->window_data_param_, deterministic, target);
  }

  // optional .caffe.PowerParameter power_param = 21;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        21, *this->power_param_, deterministic, target);
  }

  // optional .caffe.MemoryDataParameter memory_data_param = 22;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        22, *this->memory_data_param_, deterministic, target);
  }

  // optional .caffe.ArgMaxParameter argmax_param = 23;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        23, *this->argmax_param_, deterministic, target);
  }

  // optional .caffe.EltwiseParameter eltwise_param = 24;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        24, *this->eltwise_param_, deterministic, target);
  }

  // optional .caffe.ThresholdParameter threshold_param = 25;
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        25, *this->threshold_param_, deterministic, target);
  }

  // optional .caffe.DummyDataParameter dummy_data_param = 26;
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        26, *this->dummy_data_param_, deterministic, target);
  }

  // optional .caffe.AccuracyParameter accuracy_param = 27;
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        27, *this->accuracy_param_, deterministic, target);
  }

  // optional .caffe.HingeLossParameter hinge_loss_param = 29;
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        29, *this->hinge_loss_param_, deterministic, target);
  }

  // optional .caffe.ReLUParameter relu_param = 30;
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        30, *this->relu_param_, deterministic, target);
  }

  // optional .caffe.SliceParameter slice_param = 31;
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        31, *this->slice_param_, deterministic, target);
  }

  // repeated .caffe.NetStateRule include = 32;
  for (unsigned int i = 0, n = this->include_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        32, this->include(i), deterministic, target);
  }

  // repeated .caffe.NetStateRule exclude = 33;
  for (unsigned int i = 0, n = this->exclude_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        33, this->exclude(i), deterministic, target);
  }

  // optional .caffe.MVNParameter mvn_param = 34;
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        34, *this->mvn_param_, deterministic, target);
  }

  // repeated float loss_weight = 35;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(35, this->loss_weight_, target);

  // optional .caffe.TransformationParameter transform_param = 36;
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        36, *this->transform_param_, deterministic, target);
  }

  // optional .caffe.TanHParameter tanh_param = 37;
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        37, *this->tanh_param_, deterministic, target);
  }

  // optional .caffe.SigmoidParameter sigmoid_param = 38;
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        38, *this->sigmoid_param_, deterministic, target);
  }

  // optional .caffe.SoftmaxParameter softmax_param = 39;
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        39, *this->softmax_param_, deterministic, target);
  }

  // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 40;
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        40, *this->contrastive_loss_param_, deterministic, target);
  }

  // optional .caffe.ExpParameter exp_param = 41;
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        41, *this->exp_param_, deterministic, target);
  }

  // optional .caffe.LossParameter loss_param = 42;
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        42, *this->loss_param_, deterministic, target);
  }

  // repeated string param = 1001;
  for (int i = 0, n = this->param_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->param(i).data(), this->param(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.param");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1001, this->param(i), target);
  }

  // repeated .caffe.V1LayerParameter.DimCheckMode blob_share_mode = 1002;
  target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
    1002, this->blob_share_mode_, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.V1LayerParameter)
  return target;
}